

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void dynamic_switch_emulator_id(uint index)

{
  uint uVar1;
  reference pvVar2;
  type pPVar3;
  uint local_94;
  uint channel;
  Player *new_player;
  unique_lock<std::mutex> lock;
  Player *player;
  undefined1 local_60 [8];
  Emulator_Id new_id;
  Emulator_Id old_id;
  uint index_local;
  
  if (index != active_emulator_id) {
    pvVar2 = std::vector<Emulator_Id,_std::allocator<Emulator_Id>_>::operator[]
                       (&emulator_ids,(ulong)active_emulator_id);
    Emulator_Id::Emulator_Id((Emulator_Id *)((long)&new_id.name.field_2 + 8),pvVar2);
    pvVar2 = std::vector<Emulator_Id,_std::allocator<Emulator_Id>_>::operator[]
                       (&emulator_ids,(ulong)index);
    Emulator_Id::Emulator_Id((Emulator_Id *)local_60,pvVar2);
    lock._8_8_ = active_player();
    Player::take_lock((Player *)&new_player);
    (**(code **)(*(long *)lock._8_8_ + 0x28))();
    if (new_id.name.field_2._8_4_ == local_60._0_4_) {
      (**(code **)(*(long *)lock._8_8_ + 0x38))(lock._8_8_,local_60._4_4_);
    }
    else {
      pPVar3 = std::unique_ptr<Player,_std::default_delete<Player>_>::operator*
                         (::player + (uint)local_60._0_4_);
      (*pPVar3->_vptr_Player[7])(pPVar3,(ulong)(uint)local_60._4_4_);
      uVar1 = (**(code **)(*(long *)lock._8_8_ + 0x50))();
      (*pPVar3->_vptr_Player[0xb])(pPVar3,(ulong)uVar1);
      uVar1 = (**(code **)(*(long *)lock._8_8_ + 0x78))();
      (*pPVar3->_vptr_Player[0xe])(pPVar3,(ulong)uVar1);
      for (local_94 = 0; local_94 < 0x10; local_94 = local_94 + 1) {
        (*pPVar3->_vptr_Player[0x19])(pPVar3,(ulong)local_94,(ulong)channel_map[local_94].bank_msb);
        (*pPVar3->_vptr_Player[0x1a])(pPVar3,(ulong)local_94,(ulong)channel_map[local_94].bank_lsb);
        (*pPVar3->_vptr_Player[0x17])(pPVar3,(ulong)local_94,(ulong)channel_map[local_94].gm);
      }
    }
    active_emulator_id = index;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&new_player);
    Emulator_Id::~Emulator_Id((Emulator_Id *)local_60);
    Emulator_Id::~Emulator_Id((Emulator_Id *)((long)&new_id.name.field_2 + 8));
  }
  return;
}

Assistant:

void dynamic_switch_emulator_id(unsigned index)
{
    if (index == active_emulator_id)
        return;

    Emulator_Id old_id = emulator_ids[active_emulator_id];
    Emulator_Id new_id  = emulator_ids[index];

    Player &player = active_player();
    auto lock = player.take_lock();

    player.panic();
    if (old_id.player == new_id.player) {
        player.set_emulator(new_id.emulator);
    }
    else {
        Player &new_player = *::player[(unsigned)new_id.player];
        new_player.set_emulator(new_id.emulator);
        new_player.set_chip_count(player.chip_count());
        new_player.set_channel_alloc_mode(player.get_channel_alloc_mode());
        // transmit bank change and program change events
        for (unsigned channel = 0; channel < 16; ++channel) {
            new_player.rt_bank_change_msb(channel, channel_map[channel].bank_msb);
            new_player.rt_bank_change_lsb(channel, channel_map[channel].bank_lsb);
            new_player.rt_program_change(channel, channel_map[channel].gm);
        }
    }

    ::active_emulator_id = index;
}